

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathEllipticalArcTo
          (ImDrawList *this,ImVec2 *center,ImVec2 *radius,float rot,float a_min,float a_max,
          int num_segments)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  int iVar3;
  ImVec2 *pIVar4;
  ImVec2 *pIVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  if (num_segments < 1) {
    uVar10 = -(uint)(radius->y <= radius->x);
    num_segments = _CalcCircleAutoSegmentCount
                             (this,(float)(~uVar10 & (uint)radius->y | (uint)radius->x & uVar10));
  }
  lVar9 = (long)(num_segments + 1) + (long)(this->_Path).Size;
  iVar6 = (int)lVar9;
  if ((this->_Path).Capacity < iVar6) {
    pIVar4 = (ImVec2 *)ImGui::MemAlloc(lVar9 * 8);
    pIVar5 = (this->_Path).Data;
    if (pIVar5 != (ImVec2 *)0x0) {
      memcpy(pIVar4,pIVar5,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = pIVar4;
    (this->_Path).Capacity = iVar6;
  }
  fVar11 = cosf(rot);
  fVar12 = sinf(rot);
  iVar6 = 0;
  do {
    fVar13 = ((float)iVar6 / (float)num_segments) * (a_max - a_min) + a_min;
    fVar14 = cosf(fVar13);
    fVar14 = fVar14 * radius->x;
    fVar13 = sinf(fVar13);
    fVar13 = fVar13 * radius->y;
    IVar1 = *center;
    iVar8 = (this->_Path).Size;
    if (iVar8 == (this->_Path).Capacity) {
      if (iVar8 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar8 / 2 + iVar8;
      }
      iVar7 = iVar8 + 1;
      if (iVar8 + 1 < iVar3) {
        iVar7 = iVar3;
      }
      pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
      pIVar4 = (this->_Path).Data;
      if (pIVar4 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar4,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar5;
      (this->_Path).Capacity = iVar7;
      iVar8 = (this->_Path).Size;
    }
    else {
      pIVar5 = (this->_Path).Data;
    }
    IVar2.y = IVar1.y + fVar14 * fVar12 + fVar13 * fVar11;
    IVar2.x = IVar1.x + fVar14 * fVar11 + -fVar13 * fVar12;
    pIVar5[iVar8] = IVar2;
    (this->_Path).Size = (this->_Path).Size + 1;
    iVar6 = iVar6 + 1;
  } while (num_segments + 1 != iVar6);
  return;
}

Assistant:

void ImDrawList::PathEllipticalArcTo(const ImVec2& center, const ImVec2& radius, float rot, float a_min, float a_max, int num_segments)
{
    if (num_segments <= 0)
        num_segments = _CalcCircleAutoSegmentCount(ImMax(radius.x, radius.y)); // A bit pessimistic, maybe there's a better computation to do here.

    _Path.reserve(_Path.Size + (num_segments + 1));

    const float cos_rot = ImCos(rot);
    const float sin_rot = ImSin(rot);
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = a_min + ((float)i / (float)num_segments) * (a_max - a_min);
        ImVec2 point(ImCos(a) * radius.x, ImSin(a) * radius.y);
        const ImVec2 rel((point.x * cos_rot) - (point.y * sin_rot), (point.x * sin_rot) + (point.y * cos_rot));
        point.x = rel.x + center.x;
        point.y = rel.y + center.y;
        _Path.push_back(point);
    }
}